

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

ly_ctx * ly_ctx_new_yl_common
                   (char *search_dir,char *input,LYD_FORMAT format,
                   _func_lyd_node_ptr_ly_ctx_ptr_char_ptr_LYD_FORMAT_int_varargs *parser_func)

{
  int iVar1;
  lys_module *module_00;
  LY_ERR *pLVar2;
  ly_ctx *local_78;
  ly_ctx *ctx;
  lyd_node *yltree;
  lys_module *mod;
  ly_set features;
  char *revision;
  char *name;
  lyd_node *node;
  lyd_node *module;
  uint u;
  _func_lyd_node_ptr_ly_ctx_ptr_char_ptr_LYD_FORMAT_int_varargs *parser_func_local;
  LYD_FORMAT format_local;
  char *input_local;
  char *search_dir_local;
  
  memset(&mod,0,0x10);
  ctx = (ly_ctx *)0x0;
  local_78 = ly_ctx_new(search_dir);
  if ((local_78 == (ly_ctx *)0x0) ||
     (ctx = (ly_ctx *)(*parser_func)(local_78,input,format,0,0), ctx == (ly_ctx *)0x0)) {
LAB_00110879:
    ly_ctx_destroy(local_78,(_func_void_lys_node_ptr_void_ptr *)0x0);
    local_78 = (ly_ctx *)0x0;
  }
  else {
    for (node = (lyd_node *)(ctx->dict).recs[2].next; node != (lyd_node *)0x0; node = node->next) {
      if (node->schema->nodetype != LYS_LEAF) {
        revision = (char *)0x0;
        features.set.s = (lys_node **)0x0;
        ly_set_clean((ly_set *)&mod);
        for (name = (char *)node->child; name != (char *)0x0; name = *(char **)(name + 0x18)) {
          iVar1 = strcmp((char *)**(undefined8 **)name,"name");
          if (iVar1 == 0) {
            revision = *(char **)(name + 0x30);
          }
          else {
            iVar1 = strcmp((char *)**(undefined8 **)name,"revision");
            if (iVar1 == 0) {
              features.set = *(ly_set_set *)(name + 0x30);
            }
            else {
              iVar1 = strcmp((char *)**(undefined8 **)name,"feature");
              if (iVar1 == 0) {
                ly_set_add((ly_set *)&mod,name,1);
              }
              else {
                iVar1 = strcmp((char *)**(undefined8 **)name,"conformance-type");
                if ((iVar1 == 0) && (*(int *)(*(long *)(name + 0x38) + 0x1c) != 0))
                goto LAB_0011085e;
              }
            }
          }
        }
        module_00 = ly_ctx_load_module(local_78,revision,(char *)features.set.s);
        if (module_00 == (lys_module *)0x0) {
          pLVar2 = ly_errno_location();
          *pLVar2 = LY_EINVAL;
          ly_log(LY_LLERR,"Unable to load module specified by yang library data.");
          goto LAB_00110879;
        }
        for (module._4_4_ = 0; module._4_4_ < mod._4_4_; module._4_4_ = module._4_4_ + 1) {
          lys_features_enable(module_00,
                              *(char **)(*(long *)(features._0_8_ + (ulong)module._4_4_ * 8) + 0x30)
                             );
        }
      }
LAB_0011085e:
    }
  }
  if (ctx != (ly_ctx *)0x0) {
    lyd_free_withsiblings((lyd_node *)ctx);
  }
  return local_78;
}

Assistant:

static struct ly_ctx *
ly_ctx_new_yl_common(const char *search_dir, const char *input, LYD_FORMAT format,
                     struct lyd_node* (*parser_func)(struct ly_ctx*, const char*, LYD_FORMAT, int,...))
{
    unsigned int u;
    struct lyd_node *module, *node;
    const char *name, *revision;
    struct ly_set features = {0, 0, {NULL}};
    const struct lys_module *mod;
    struct lyd_node *yltree = NULL;
    struct ly_ctx *ctx = NULL;

    /* create empty (with internal modules including ietf-yang-library) context */
    ctx = ly_ctx_new(search_dir);
    if (!ctx) {
        goto error;
    }

    /* parse yang library data tree */
    yltree = parser_func(ctx, input, format, LYD_OPT_DATA, NULL);
    if (!yltree) {
        goto error;
    }

    /* process the data tree */
    LY_TREE_FOR(yltree->child, module) {
        if (module->schema->nodetype == LYS_LEAF) {
            /* module-set-id - ignore it */
            continue;
        }

        /* initiate */
        name = NULL;
        revision = NULL;
        ly_set_clean(&features);

        LY_TREE_FOR(module->child, node) {
            if (!strcmp(node->schema->name, "name")) {
                name = ((struct lyd_node_leaf_list*)node)->value_str;
            } else if (!strcmp(node->schema->name, "revision")) {
                revision = ((struct lyd_node_leaf_list*)node)->value_str;
            } else if (!strcmp(node->schema->name, "feature")) {
                ly_set_add(&features, node, LY_SET_OPT_USEASLIST);
            } else if (!strcmp(node->schema->name, "conformance-type") &&
                    ((struct lyd_node_leaf_list*)node)->value.enm->value) {
                /* imported module - skip it, it will be loaded as a side effect
                 * of loading another module */
                goto next_module;
            }
        }

        /* use the gathered data to load the module */
        mod = ly_ctx_load_module(ctx, name, revision);
        if (!mod) {
            LOGERR(LY_EINVAL, "Unable to load module specified by yang library data.");
            goto error;
        }

        /* set features */
        for (u = 0; u < features.number; u++) {
            lys_features_enable(mod, ((struct lyd_node_leaf_list*)features.set.d[u])->value_str);
        }

next_module:;
    }

    if (0) {
        /* skip context destroy in case of success */
error:
        ly_ctx_destroy(ctx, NULL);
        ctx = NULL;
    }

    /* cleanup */
    if (yltree) {
        /* yang library data tree */
        lyd_free_withsiblings(yltree);
    }

    return ctx;
}